

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void testing::internal::XmlUnitTestResultPrinter::PrintXmlTestSuite
               (ostream *stream,TestSuite *test_suite)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  ostream *poVar4;
  TestInfo *this;
  TestSuite *in_RSI;
  TestSuite *in_RDI;
  TestInfo *in_stack_000000a0;
  char *in_stack_000000a8;
  ostream *in_stack_000000b0;
  int i;
  string kTestsuite;
  TestInfo *in_stack_fffffffffffffc08;
  TestSuite *in_stack_fffffffffffffc10;
  int *in_stack_fffffffffffffc28;
  undefined4 in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc34;
  char *in_stack_fffffffffffffc38;
  TestSuite *pTVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc40;
  TestSuite *result;
  undefined4 in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffcdc;
  string *in_stack_fffffffffffffce0;
  string *in_stack_fffffffffffffce8;
  string *element_name;
  int local_2dc;
  string local_2d8 [32];
  string local_2b8 [39];
  allocator<char> local_291;
  string local_290 [32];
  string local_270 [8];
  TimeInMillis in_stack_fffffffffffffd98;
  allocator<char> local_249;
  string local_248 [39];
  allocator<char> local_221;
  string local_220 [39];
  allocator<char> local_1f9;
  string local_1f8 [36];
  int local_1d4;
  string local_1d0 [39];
  allocator<char> local_1a9;
  string local_1a8 [36];
  int local_184;
  string local_180 [39];
  allocator<char> local_159;
  TimeInMillis in_stack_fffffffffffffea8;
  string local_130 [39];
  allocator<char> local_109;
  string local_108 [36];
  int local_e4;
  string local_e0 [39];
  undefined1 local_b9 [40];
  ostream local_91;
  string local_90 [39];
  allocator<char> local_69;
  string local_68 [55];
  allocator<char> local_31;
  string local_30 [32];
  TestSuite *local_10;
  TestSuite *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  std::allocator<char>::~allocator(&local_31);
  poVar4 = std::operator<<((ostream *)local_8,"  <");
  std::operator<<(poVar4,local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  TestSuite::name((TestSuite *)0x15224c);
  poVar4 = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  OutputXmlAttribute(poVar4,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                     (string *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  element_name = (string *)local_b9;
  pTVar5 = local_8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
             (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
  iVar2 = TestSuite::reportable_test_count((TestSuite *)0x152335);
  local_e4 = iVar2;
  StreamableToString<int>(in_stack_fffffffffffffc28);
  OutputXmlAttribute(poVar4,element_name,(string *)pTVar5,
                     (string *)CONCAT44(iVar2,in_stack_fffffffffffffcd8));
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string((string *)(local_b9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_b9);
  if ((FLAGS_gtest_list_tests & 1) == 0) {
    result = local_8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    TestSuite::failed_test_count((TestSuite *)0x15240e);
    StreamableToString<int>(in_stack_fffffffffffffc28);
    OutputXmlAttribute(poVar4,element_name,(string *)pTVar5,
                       (string *)CONCAT44(iVar2,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_108);
    std::allocator<char>::~allocator(&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    local_184 = TestSuite::reportable_disabled_test_count((TestSuite *)0x1524da);
    StreamableToString<int>(in_stack_fffffffffffffc28);
    OutputXmlAttribute(poVar4,element_name,(string *)pTVar5,
                       (string *)CONCAT44(iVar2,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_180);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffea8);
    std::allocator<char>::~allocator(&local_159);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    local_1d4 = TestSuite::skipped_test_count((TestSuite *)0x1525a6);
    StreamableToString<int>(in_stack_fffffffffffffc28);
    OutputXmlAttribute(poVar4,element_name,(string *)pTVar5,
                       (string *)CONCAT44(iVar2,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_1a8);
    std::allocator<char>::~allocator(&local_1a9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    OutputXmlAttribute(poVar4,element_name,(string *)pTVar5,
                       (string *)CONCAT44(iVar2,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_220);
    std::allocator<char>::~allocator(&local_221);
    std::__cxx11::string::~string(local_1f8);
    std::allocator<char>::~allocator(&local_1f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    TestSuite::elapsed_time(local_10);
    FormatTimeInMillisAsSeconds_abi_cxx11_(in_stack_fffffffffffffd98);
    OutputXmlAttribute(poVar4,element_name,(string *)pTVar5,
                       (string *)CONCAT44(iVar2,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_270);
    std::__cxx11::string::~string(local_248);
    std::allocator<char>::~allocator(&local_249);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,
               (allocator<char> *)CONCAT44(in_stack_fffffffffffffc34,in_stack_fffffffffffffc30));
    TestSuite::start_timestamp(local_10);
    FormatEpochTimeInMillisAsIso8601_abi_cxx11_(in_stack_fffffffffffffea8);
    OutputXmlAttribute(poVar4,element_name,(string *)pTVar5,
                       (string *)CONCAT44(iVar2,in_stack_fffffffffffffcd8));
    std::__cxx11::string::~string(local_2b8);
    std::__cxx11::string::~string(local_290);
    std::allocator<char>::~allocator(&local_291);
    pTVar5 = local_8;
    TestSuite::ad_hoc_test_result(local_10);
    TestPropertiesAsXmlAttributes_abi_cxx11_((TestResult *)result);
    std::operator<<((ostream *)pTVar5,local_2d8);
    std::__cxx11::string::~string(local_2d8);
  }
  std::operator<<((ostream *)local_8,">\n");
  local_2dc = 0;
  while (iVar2 = local_2dc, iVar3 = TestSuite::total_test_count((TestSuite *)0x152cd6),
        iVar2 < iVar3) {
    this = TestSuite::GetTestInfo
                     (in_stack_fffffffffffffc10,(int)((ulong)in_stack_fffffffffffffc08 >> 0x20));
    bVar1 = TestInfo::is_reportable(this);
    iVar2 = (int)((ulong)in_stack_fffffffffffffc08 >> 0x20);
    if (bVar1) {
      in_stack_fffffffffffffc10 = local_8;
      TestSuite::name((TestSuite *)0x152d33);
      in_stack_fffffffffffffc08 = TestSuite::GetTestInfo(in_stack_fffffffffffffc10,iVar2);
      OutputXmlTestInfo(in_stack_000000b0,in_stack_000000a8,in_stack_000000a0);
    }
    local_2dc = local_2dc + 1;
  }
  poVar4 = std::operator<<((ostream *)local_8,"  </");
  poVar4 = std::operator<<(poVar4,local_30);
  std::operator<<(poVar4,">\n");
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void XmlUnitTestResultPrinter::PrintXmlTestSuite(std::ostream* stream,
                                                 const TestSuite& test_suite) {
  const std::string kTestsuite = "testsuite";
  *stream << "  <" << kTestsuite;
  OutputXmlAttribute(stream, kTestsuite, "name", test_suite.name());
  OutputXmlAttribute(stream, kTestsuite, "tests",
                     StreamableToString(test_suite.reportable_test_count()));
  if (!GTEST_FLAG_GET(list_tests)) {
    OutputXmlAttribute(stream, kTestsuite, "failures",
                       StreamableToString(test_suite.failed_test_count()));
    OutputXmlAttribute(
        stream, kTestsuite, "disabled",
        StreamableToString(test_suite.reportable_disabled_test_count()));
    OutputXmlAttribute(stream, kTestsuite, "skipped",
                       StreamableToString(test_suite.skipped_test_count()));

    OutputXmlAttribute(stream, kTestsuite, "errors", "0");

    OutputXmlAttribute(stream, kTestsuite, "time",
                       FormatTimeInMillisAsSeconds(test_suite.elapsed_time()));
    OutputXmlAttribute(
        stream, kTestsuite, "timestamp",
        FormatEpochTimeInMillisAsIso8601(test_suite.start_timestamp()));
    *stream << TestPropertiesAsXmlAttributes(test_suite.ad_hoc_test_result());
  }
  *stream << ">\n";
  for (int i = 0; i < test_suite.total_test_count(); ++i) {
    if (test_suite.GetTestInfo(i)->is_reportable())
      OutputXmlTestInfo(stream, test_suite.name(), *test_suite.GetTestInfo(i));
  }
  *stream << "  </" << kTestsuite << ">\n";
}